

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

BOOL QueryPerformanceFrequency(LARGE_INTEGER *lpFrequency)

{
  if ((PAL_InitializeChakraCoreCalled) &&
     (lpFrequency->QuadPart = 1000000000, PAL_InitializeChakraCoreCalled != false)) {
    return 1;
  }
  abort();
}

Assistant:

BOOL
PALAPI
QueryPerformanceFrequency(
    OUT LARGE_INTEGER *lpFrequency
    )
{
    BOOL retval = TRUE;
    PERF_ENTRY(QueryPerformanceFrequency);
    ENTRY("QueryPerformanceFrequency()\n");

    lpFrequency->QuadPart = (LONGLONG)(tccSecondsToNanoSeconds);

    LOGEXIT("QueryPerformanceFrequency\n");
    PERF_EXIT(QueryPerformanceFrequency);
    return retval;
}